

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msocket_adapter.cpp
# Opt level: O0

void msocket_adapter_udp_msg(void *arg,char *addr,uint16_t port,uint8_t *dataBuf,uint32_t dataLen)

{
  size_t size;
  allocator<char> local_59;
  string local_58 [8];
  string address;
  Handler *handler;
  uint32_t dataLen_local;
  uint8_t *dataBuf_local;
  uint16_t port_local;
  char *addr_local;
  void *arg_local;
  
  if (arg != (void *)0x0) {
    address.field_2._8_8_ = arg;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_58,addr,&local_59);
    std::allocator<char>::~allocator(&local_59);
    (**(code **)(*(long *)address.field_2._8_8_ + 8))
              (address.field_2._8_8_,local_58,port,dataBuf,dataLen);
    std::__cxx11::string::~string(local_58);
  }
  return;
}

Assistant:

static void msocket_adapter_udp_msg(void* arg, const char* addr, uint16_t port, const uint8_t* dataBuf, uint32_t dataLen)
{
   auto handler = reinterpret_cast<msocket::Handler*>(arg);
   if (handler != nullptr)
   {
      std::string address{ addr };
      std::size_t size = static_cast<std::size_t>(dataLen);
      handler->udp_message_received(address, port, dataBuf, size);
   }
}